

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

qsizetype QtPrivate::indexOf<QString,QStringBuilder<QLatin1String,QString&>>
                    (QList<QString> *vector,QStringBuilder<QLatin1String,_QString_&> *u,
                    qsizetype from)

{
  bool bVar1;
  qsizetype qVar2;
  longlong *plVar3;
  const_iterator cVar4;
  const_iterator *this;
  QList<QString> *this_00;
  long in_RDX;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  const_iterator e;
  const_iterator n;
  QStringBuilder<QLatin1String,_QString_&> *in_stack_ffffffffffffff58;
  QList<QString> *in_stack_ffffffffffffff60;
  long local_78;
  qsizetype local_60;
  const_iterator local_20;
  longlong local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = in_RDX;
  if (in_RDX < 0) {
    qVar2 = QList<QString>::size(in_RDI);
    local_10 = in_RDX + qVar2;
    local_18 = 0;
    plVar3 = qMax<long_long>(&local_10,&local_18);
    local_78 = *plVar3;
  }
  qVar2 = QList<QString>::size(in_RDI);
  if (local_78 < qVar2) {
    local_20.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::begin(in_stack_ffffffffffffff60);
    QList<QString>::const_iterator::operator+
              ((const_iterator *)in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff58);
    local_20 = QList<QString>::const_iterator::operator-
                         ((const_iterator *)in_stack_ffffffffffffff60,
                          (qsizetype)in_stack_ffffffffffffff58);
    cVar4 = QList<QString>::end(in_stack_ffffffffffffff60);
    do {
      this = QList<QString>::const_iterator::operator++(&local_20);
      bVar1 = QList<QString>::const_iterator::operator!=(this,cVar4);
      if (!bVar1) goto LAB_00340933;
      this_00 = (QList<QString> *)QList<QString>::const_iterator::operator*(&local_20);
      ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff58);
      bVar1 = ::operator==((QString *)this_00,(QString *)in_stack_ffffffffffffff58);
      QString::~QString((QString *)0x3408fa);
    } while (!bVar1);
    cVar4 = QList<QString>::begin(this_00);
    local_60 = QList<QString>::const_iterator::operator-(&local_20,cVar4);
  }
  else {
LAB_00340933:
    local_60 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_60;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}